

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O3

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh(TPZAcademicGeoMesh *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  TPZGeoMesh *this_00;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  int64_t index;
  TPZManVector<long,_5> elnodes;
  long local_138;
  undefined1 local_e0 [8];
  TPZVec<long> local_d8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  TPZVec<long> local_78;
  _func_int **local_58 [5];
  
  lVar3 = this->fNumberElements;
  uVar2 = this->fMaterialId;
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_00);
  this_00->fDim = 3;
  GenerateNodes(this,this_00);
  if (0 < lVar3) {
    lVar1 = lVar3 + 1;
    local_138 = 0;
    do {
      lVar6 = 0;
      do {
        lVar9 = lVar6 * lVar1 + local_138;
        lVar6 = lVar6 + 1;
        lVar7 = lVar6 * lVar1 + local_138;
        lVar11 = 0;
        do {
          TPZVec<long>::TPZVec(&local_d8,0);
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
          local_d8.fStore = &local_b8;
          local_d8.fNElements = 8;
          lVar5 = lVar1 * lVar1 * lVar11;
          local_b8 = lVar9 + lVar5;
          local_d8.fNAlloc = 0;
          local_b0 = lVar9 + 1 + lVar5;
          local_a0 = lVar7 + lVar5;
          local_a8 = lVar5 + lVar7 + 1;
          lVar11 = lVar11 + 1;
          local_88 = lVar1 * lVar1 * lVar11;
          local_98 = lVar9 + local_88;
          local_90 = lVar9 + local_88 + 1;
          local_80 = lVar7 + local_88;
          local_88 = lVar7 + 1 + local_88;
          lVar5 = 0;
          bVar4 = true;
          do {
            bVar10 = bVar4;
            TPZVec<long>::TPZVec(&local_78,0);
            local_78._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0188d9a8;
            local_78.fStore = (long *)local_58;
            local_78.fNElements = 5;
            local_78.fNAlloc = 0;
            lVar8 = 4;
            do {
              (&local_78._vptr_TPZVec)[lVar8] =
                   (_func_int **)local_d8.fStore[*(int *)(&UNK_0157c770 + lVar8 * 4 + lVar5 * 0x14)]
              ;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 9);
            (*(this_00->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_00,5,&local_78,(ulong)uVar2,local_e0,1);
            (*local_78._vptr_TPZVec[3])(&local_78,4);
            lVar8 = 0;
            do {
              local_78.fStore[lVar8] = (long)local_d8.fStore[tetraedra[lVar5][lVar8]];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            (*(this_00->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_00,4,&local_78,(ulong)uVar2,local_e0,1);
            if ((_func_int ***)local_78.fStore != local_58) {
              local_78.fNAlloc = 0;
              local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
              if ((_func_int ***)local_78.fStore != (_func_int ***)0x0) {
                operator_delete__(local_78.fStore);
              }
            }
            lVar5 = 1;
            bVar4 = false;
          } while (bVar10);
          if (local_d8.fStore != &local_b8) {
            local_d8.fNAlloc = 0;
            local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
            if (local_d8.fStore != (long *)0x0) {
              operator_delete__(local_d8.fStore);
            }
          }
        } while (lVar11 != lVar3);
      } while (lVar6 != lVar3);
      local_138 = local_138 + 1;
    } while (local_138 != lVar3);
  }
  TPZGeoMesh::BuildConnectivity(this_00);
  AddBoundaryElementsByCoord(this,this_00);
  if (this->fShouldDeform != false) {
    DeformGMesh(this,this_00);
  }
  return this_00;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    const int dim = 3;
    gmesh->SetDimension(dim);
    GenerateNodes(gmesh);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Pyramid and tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<2; el++)
                {
                    TPZManVector<int64_t,5> elnodes(5);
                    for (int il=0; il<5; il++) {
                        elnodes[il] = nodes[pyramid[el][il]];
                    }
                    int64_t index;
                    gmesh->CreateGeoElement(EPiramide, elnodes, MaterialId, index);
                    elnodes.resize(4);
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
//    AddBoundaryElements(gmesh);
    AddBoundaryElementsByCoord(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}